

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

int AF_AActor_A_Burst(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                     VMReturn *ret,int numret)

{
  double dVar1;
  double dVar2;
  double dVar3;
  PClassActor *type;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  undefined4 extraout_var;
  PClass *pPVar10;
  AActor *this;
  PClassActor *pPVar11;
  AActor *other;
  char *pcVar12;
  bool bVar13;
  DVector2 v;
  DVector3 local_48;
  PClass *pPVar9;
  undefined4 extraout_var_00;
  
  pPVar10 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar12 = "(paramnum) < numparam";
    goto LAB_003d72e4;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003d72cb:
    pcVar12 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003d72e4:
    __assert_fail(pcVar12,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xe95,"int AF_AActor_A_Burst(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  other = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (other == (AActor *)0x0) goto LAB_003d6fd6;
    pPVar9 = (other->super_DThinker).super_DObject.Class;
    if (pPVar9 == (PClass *)0x0) {
      iVar4 = (**(other->super_DThinker).super_DObject._vptr_DObject)(other);
      pPVar9 = (PClass *)CONCAT44(extraout_var,iVar4);
      (other->super_DThinker).super_DObject.Class = pPVar9;
    }
    bVar13 = pPVar9 == (PClass *)0x0;
    ret = (VMReturn *)CONCAT71((int7)((ulong)ret >> 8),!bVar13);
    defaultparam = (TArray<VMValue,_VMValue> *)
                   CONCAT71((int7)((ulong)defaultparam >> 8),pPVar9 == pPVar10 || bVar13);
    if (pPVar9 != pPVar10 && !bVar13) {
      do {
        pPVar9 = pPVar9->ParentClass;
        ret = (VMReturn *)CONCAT71((int7)((ulong)ret >> 8),pPVar9 != (PClass *)0x0);
        if (pPVar9 == pPVar10) break;
      } while (pPVar9 != (PClass *)0x0);
    }
    if ((char)ret == '\0') {
      pcVar12 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003d72e4;
    }
  }
  else {
    if (other != (AActor *)0x0) goto LAB_003d72cb;
LAB_003d6fd6:
    other = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar12 = "(paramnum) < numparam";
  }
  else {
    if (param[1].field_0.field_3.Type == '\x03') {
      type = (PClassActor *)param[1].field_0.field_1.a;
      if (param[1].field_0.field_1.atag == 1) {
        if (type != (PClassActor *)0x0) {
          pPVar11 = type;
          if (type != (PClassActor *)AActor::RegistrationInfo.MyClass) {
            do {
              ret = (VMReturn *)(pPVar11->super_PClass).ParentClass;
              if ((PClass *)ret == AActor::RegistrationInfo.MyClass) break;
              pPVar11 = (PClassActor *)ret;
            } while ((PClassActor *)ret != (PClassActor *)0x0);
            if ((PClassActor *)ret == (PClassActor *)0x0) {
              pcVar12 = "chunk == NULL || chunk->IsDescendantOf(RUNTIME_CLASS(AActor))";
              goto LAB_003d7303;
            }
          }
          (other->Vel).X = 0.0;
          (other->Vel).Y = 0.0;
          (other->Vel).Z = 0.0;
          pPVar10 = (other->super_DThinker).super_DObject.Class;
          if (pPVar10 == (PClass *)0x0) {
            iVar4 = (**(other->super_DThinker).super_DObject._vptr_DObject)
                              (other,defaultparam,type,ret);
            pPVar10 = (PClass *)CONCAT44(extraout_var_00,iVar4);
            (other->super_DThinker).super_DObject.Class = pPVar10;
          }
          dVar1 = *(double *)(pPVar10->Defaults + 0x180);
          other->Height = dVar1;
          iVar5 = (int)(dVar1 * other->radius);
          iVar4 = iVar5 + 0x1f;
          if (-1 < iVar5) {
            iVar4 = iVar5;
          }
          uVar8 = 4;
          if (4 < iVar4 >> 5) {
            uVar8 = iVar4 >> 5;
          }
          uVar6 = FRandom::GenRand32(&pr_burst);
          uVar7 = FRandom::GenRand32(&pr_burst);
          iVar5 = (int)((uVar6 & 0xff) - (uVar7 & 0xff)) % (int)(uVar8 >> 2) + uVar8;
          iVar4 = 0x18;
          if (0x18 < iVar5) {
            iVar4 = iVar5;
          }
          iVar4 = iVar4 + 1;
          do {
            uVar8 = FRandom::GenRand32(&pr_burst);
            dVar1 = other->radius;
            uVar6 = FRandom::GenRand32(&pr_burst);
            dVar2 = other->radius;
            uVar7 = FRandom::GenRand32(&pr_burst);
            dVar3 = other->Height;
            P_GetOffsetPosition((other->__Pos).X,(other->__Pos).Y,
                                (double)(int)((uVar8 & 0xff) - 0x80) * dVar1 * 0.0078125,
                                (double)(int)((uVar6 & 0xff) - 0x80) * dVar2 * 0.0078125);
            local_48.Z = ((double)(uVar7 & 0xff) * dVar3) / 255.0 + (other->__Pos).Z;
            this = AActor::StaticSpawn(type,&local_48,ALLOW_REPLACE,false);
            if (this != (AActor *)0x0) {
              (this->Vel).Z = (((this->__Pos).Z - (other->__Pos).Z) * 4.0) / other->Height;
              uVar8 = FRandom::GenRand32(&pr_burst);
              uVar6 = FRandom::GenRand32(&pr_burst);
              (this->Vel).X = (double)(int)((uVar8 & 0xff) - (uVar6 & 0xff)) * 0.0078125;
              uVar8 = FRandom::GenRand32(&pr_burst);
              uVar6 = FRandom::GenRand32(&pr_burst);
              (this->Vel).Y = (double)(int)((uVar8 & 0xff) - (uVar6 & 0xff)) * 0.0078125;
              this->RenderStyle = other->RenderStyle;
              this->Alpha = other->Alpha;
              AActor::CopyFriendliness(this,other,true,true);
            }
            iVar5 = iVar4 + -1;
            bVar13 = 0 < iVar4;
            iVar4 = iVar5;
          } while (iVar5 != 0 && bVar13);
          if (((other->flags4).Value & 8) != 0) {
            A_BossDeath(other);
          }
          A_Unblock(other,true);
          (*(other->super_DThinker).super_DObject._vptr_DObject[4])(other);
        }
        return 0;
      }
      if (type == (PClassActor *)0x0) {
        return 0;
      }
    }
    pcVar12 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_003d7303:
  __assert_fail(pcVar12,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0xe96,"int AF_AActor_A_Burst(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Burst)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_CLASS(chunk, AActor);

	int i, numChunks;
	AActor * mo;

	if (chunk == NULL)
	{
		return 0;
	}

	self->Vel.Zero();
	self->Height = self->GetDefault()->Height;

	// [RH] In Hexen, this creates a random number of shards (range [24,56])
	// with no relation to the size of the self shattering. I think it should
	// base the number of shards on the size of the dead thing, so bigger
	// things break up into more shards than smaller things.
	// An self with radius 20 and height 64 creates ~40 chunks.
	numChunks = MAX<int> (4, int(self->radius * self->Height)/32);
	i = (pr_burst.Random2()) % (numChunks/4);
	for (i = MAX (24, numChunks + i); i >= 0; i--)
	{
		double xo = (pr_burst() - 128) * self->radius / 128;
		double yo = (pr_burst() - 128) * self->radius / 128;
		double zo = (pr_burst() * self->Height / 255);
		mo = Spawn(chunk, self->Vec3Offset(xo, yo, zo), ALLOW_REPLACE);

		if (mo)
		{
			mo->Vel.Z = 4 * (mo->Z() - self->Z()) / self->Height;
			mo->Vel.X = pr_burst.Random2() / 128.;
			mo->Vel.Y = pr_burst.Random2() / 128.;
			mo->RenderStyle = self->RenderStyle;
			mo->Alpha = self->Alpha;
			mo->CopyFriendliness(self, true);
		}
	}

	// [RH] Do some stuff to make this more useful outside Hexen
	if (self->flags4 & MF4_BOSSDEATH)
	{
		A_BossDeath(self);
	}
	A_Unblock(self, true);

	self->Destroy ();
	return 0;
}